

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
ObjectPointerInObject_SaveObjectInObject_Test::~ObjectPointerInObject_SaveObjectInObject_Test
          (ObjectPointerInObject_SaveObjectInObject_Test *this)

{
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00174948;
  std::
  unique_ptr<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ::~unique_ptr(&(this->super_Test).gtest_flag_saver_);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectPointerInObject, SaveObjectInObject) {
	stringstream ss;
	pointer_obj_var2 v;
	v.val1 = 1;
	v.val2 = 1.1f;
	v.val3 = new obj_var1;
	v.val3->val1 = 1;
	v.val3->val2 = 1.1f;
	EXPECT_TRUE(JSON_OK == save_object_to_stream(v, ss));
	EXPECT_TRUE(ss.str() == "{\n"
							"	\"val1\": 1,\n"
							"	\"val2\": 1.1,\n"
							"	\"val3\": {\n"
							"		\"val1\": 1,\n"
							"		\"val2\": 1.1\n"
							"	}\n"
							"}\n");
}